

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void inactive_cb(Fl_Input *i,void *v)

{
  int iVar1;
  bool bVar2;
  Fl_Widget_Type *this;
  
  if ((char *)v == "LOAD") {
    inactive_input = i;
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if ((iVar1 != 0) &&
       (iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])(), iVar1 == 0)) {
      Fl_Widget::activate((Fl_Widget *)i);
      Fl_Input_::static_value(&i->super_Fl_Input_,current_widget->inactive_name_);
      return;
    }
    Fl_Widget::deactivate((Fl_Widget *)i);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar2 = true;
    this = (Fl_Widget_Type *)Fl_Type::first;
    do {
      while (((this->super_Fl_Type).selected != '\0' &&
             (iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar1 != 0))) {
        Fl_Widget_Type::inactive_name(this,(i->super_Fl_Input_).value_);
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
        bVar2 = false;
        if (this == (Fl_Widget_Type *)0x0) goto LAB_001835a5;
      }
      this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
    } while (this != (Fl_Widget_Type *)0x0);
    if (!bVar2) {
LAB_001835a5:
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void inactive_cb(Fl_Input* i, void *v) {
  if (v == LOAD) {
    inactive_input = i;
    if (current_widget->is_widget() && !current_widget->is_window()) {
      i->activate();
      i->static_value(((Fl_Widget_Type*)current_widget)->inactive_name());
    } else i->deactivate();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        ((Fl_Widget_Type*)o)->inactive_name(i->value());
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}